

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mygetopt.c
# Opt level: O3

int util_getopt(int argc,char **argv,char *optstring)

{
  char cVar1;
  ushort **ppuVar2;
  char *pcVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  uint __c;
  
  iVar6 = util_optind;
  if (optstring == (char *)0x0) {
    return -1;
  }
  if (argv == (char **)0x0) {
    return -1;
  }
  if (argc <= util_optind) {
    return -1;
  }
  lVar4 = (long)util_optind;
  if (util_getopt::arg == (char *)0x0) {
    pcVar3 = argv[lVar4];
    if (pcVar3 == (char *)0x0) {
      return -1;
    }
    if (*pcVar3 != '-') {
      return -1;
    }
    cVar1 = pcVar3[1];
    if (cVar1 == '\0') {
      return -1;
    }
    pcVar7 = pcVar3 + 1;
    if ((cVar1 == '-') && (pcVar3[2] == '\0')) {
      __c = 0xffffffff;
      goto LAB_00103c2b;
    }
  }
  else {
    cVar1 = *util_getopt::arg;
    pcVar7 = util_getopt::arg;
  }
  pcVar7 = pcVar7 + 1;
  __c = (uint)cVar1;
  util_optopt = __c;
  util_getopt::arg = pcVar7;
  ppuVar2 = __ctype_b_loc();
  if ((((*ppuVar2)[cVar1] & 8) == 0) || (pcVar3 = strchr(optstring,__c), pcVar3 == (char *)0x0)) {
    uVar5 = 0x3f;
    if ((util_opterr != 0) && (*optstring != ':')) {
      fprintf(_stderr,"%s: Unrecognized option: \'-%c\'\n",*argv,(ulong)__c);
    }
  }
  else {
    uVar5 = __c;
    if (pcVar3[1] == ':') {
      if (*pcVar7 != '\0') {
        util_getopt::arg = (char *)0x0;
        util_optarg = pcVar7;
        goto LAB_00103c2b;
      }
      util_optind = iVar6 + 1;
      util_optarg = argv[lVar4 + 1];
      if (util_optarg != (char *)0x0) goto LAB_00103c05;
      cVar1 = *optstring;
      if (util_opterr == 0) {
LAB_00103c78:
        uVar5 = 0x3f;
        if (cVar1 != ':') goto LAB_00103c05;
      }
      else if (cVar1 != ':') {
        fprintf(_stderr,"%s: Option -%c requires an operand\n",*argv,(ulong)__c);
        cVar1 = *optstring;
        goto LAB_00103c78;
      }
      uVar5 = 0x3a;
    }
  }
LAB_00103c05:
  __c = uVar5;
  if (util_getopt::arg == (char *)0x0) {
    return __c;
  }
  if (*util_getopt::arg != '\0') {
    return __c;
  }
  util_getopt::arg = (char *)0x0;
  iVar6 = util_optind;
LAB_00103c2b:
  util_optind = iVar6 + 1;
  return __c;
}

Assistant:

int getopt(int argc, char *const argv[], const char *optstring) {
    static char* arg = NULL;
    char*p;
    int rv;
    if(optind >= argc || !argv || !optstring) return -1;
    if(arg == NULL) {
        char *temp = argv[optind];
        if(temp == NULL) return -1;
        if(temp[0] != '-') return -1;
        if(temp[1] == '\0') return -1;
        if(temp[1] == '-' && temp[2] == '\0') { optind++; return -1; }
        arg = temp+1;
    }
    
    optopt = *arg++;
    if(isalnum(optopt) && (p=strchr(optstring,optopt))) {
        rv = optopt;
        if(p[1] == ':') {
            if(*arg) {
                /* argument of form -ffilename */
                optarg = arg;
                arg = NULL;
                optind++;
            }
            else {
                /* argument of form -f filename */
                optarg = argv[++optind]; /* optind will be increased second time later */
                if(!optarg) {
                    if(opterr && optstring[0] != ':')
                        fprintf(stderr, "%s: Option -%c requires an operand\n", argv[0], optopt);
                    rv = optstring[0] == ':' ? ':' : '?';
                }
            }
        }
    }
    else {
        if(opterr && optstring[0] != ':')
            fprintf(stderr, "%s: Unrecognized option: '-%c'\n", argv[0], optopt);
        rv = '?';
    }

    if(arg && *arg == '\0') {
        arg = NULL;
        optind++;
    }

    return rv;
}